

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
          *base,tuple<testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                *generators,bool is_end)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  *p_Var1;
  ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>
  local_40;
  ParamIterator<std::tuple<int,_int>_> local_38;
  
  (this->
  super_ParamIteratorInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_010c8ca0;
  this->base_ = base;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                  )(**(code **)(*(long *)(generators->
                                         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                                         ).
                                         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamGenerator<std::tuple<int,_int>_>,_false>
                                         ._M_head_impl.impl_.
                                         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x10))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamIterator<std::tuple<int,int>>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamIterator<std::tuple<int,int>>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamIterator<std::tuple<int,int>>>
              *)&this->begin_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
  ._M_head_impl._4_4_ = extraout_var_00;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                  )(**(code **)(*(long *)(generators->
                                         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                                         ).
                                         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamGenerator<std::tuple<int,_int>_>,_false>
                                         ._M_head_impl.impl_.
                                         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x18))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamIterator<std::tuple<int,int>>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamIterator<std::tuple<int,int>>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>,testing::internal::ParamIterator<std::tuple<int,int>>>
              *)&this->end_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>_*,_false>
                          ._M_head_impl + 8))();
  }
  p_Var1 = &(this->begin_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ;
  if (is_end) {
    p_Var1 = &(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
    ;
  }
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::_Tuple_impl(&(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                ,p_Var1);
  (this->current_value_).
  super___shared_ptr<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }